

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

bool __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::
enqueue<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>
          (ImplicitProducer *this,
          unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
          *element)

{
  ulong uVar1;
  long *plVar2;
  bool bVar3;
  Block *pBVar4;
  ulong uVar5;
  ulong *unaff_R13;
  
  uVar1 = *(ulong *)(this + 0x20);
  if ((uVar1 & 0x1f) == 0) {
    if ((*(long *)(this + 0x28) - uVar1) + 0x7fffffffffffffdf < 0x7fffffffffffffff) {
      plVar2 = *(long **)(this + 0x60);
      if (plVar2 == (long *)0x0) {
        bVar3 = false;
      }
      else {
        uVar5 = *plVar2 - 1U & plVar2[1] + 1U;
        unaff_R13 = *(ulong **)(plVar2[3] + uVar5 * 8);
        if ((*unaff_R13 == 1) || (unaff_R13[1] == 0)) {
          *unaff_R13 = uVar1;
          plVar2[1] = uVar5;
        }
        else {
          bVar3 = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                  ::ImplicitProducer::new_block_index((ImplicitProducer *)this);
          if (!bVar3) {
            bVar3 = false;
            goto LAB_00170f5d;
          }
          plVar2 = *(long **)(this + 0x60);
          uVar5 = *plVar2 - 1U & plVar2[1] + 1U;
          unaff_R13 = *(ulong **)(plVar2[3] + uVar5 * 8);
          *unaff_R13 = uVar1;
          plVar2[1] = uVar5;
        }
        bVar3 = true;
      }
LAB_00170f5d:
      if (bVar3) {
        pBVar4 = requisition_block<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                           (*(ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                              **)(this + 0x50));
        if (pBVar4 != (Block *)0x0) {
          (pBVar4->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
          unaff_R13[1] = (ulong)pBVar4;
          *(Block **)(this + 0x40) = pBVar4;
          goto LAB_00170ea4;
        }
        plVar2 = *(long **)(this + 0x60);
        plVar2[1] = *plVar2 - 1U & plVar2[1] - 1U;
        unaff_R13[1] = 0;
      }
    }
    bVar3 = false;
  }
  else {
LAB_00170ea4:
    *(coro_http_client **)(*(long *)(this + 0x40) + (uVar1 & 0x1f) * 8) =
         (element->_M_t).
         super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
         ._M_t.
         super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
         .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl;
    (element->_M_t).
    super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
    ._M_t.
    super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
    .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl =
         (coro_http_client *)0x0;
    *(ulong *)(this + 0x20) = uVar1 + 1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

inline bool enqueue(U&& element) {
      index_t currentTailIndex =
          this->tailIndex.load(std::memory_order_relaxed);
      index_t newTailIndex = 1 + currentTailIndex;
      if ((currentTailIndex & static_cast<index_t>(QUEUE_BLOCK_SIZE - 1)) ==
          0) {
        // We reached the end of a block, start a new one
        auto head = this->headIndex.load(std::memory_order_relaxed);
        assert(!details::circular_less_than<index_t>(currentTailIndex, head));
        if (!details::circular_less_than<index_t>(
                head, currentTailIndex + QUEUE_BLOCK_SIZE) ||
            (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value &&
             (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - QUEUE_BLOCK_SIZE <
                                            currentTailIndex - head))) {
          return false;
        }
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
        debug::DebugLock lock(mutex);
#endif
        // Find out where we'll be inserting this block in the block index
        BlockIndexEntry* idxEntry;
        if (!insert_block_index_entry<allocMode>(idxEntry, currentTailIndex)) {
          return false;
        }

        // Get ahold of a new block
        auto newBlock =
            this->parent
                ->ConcurrentQueue::template requisition_block<allocMode>();
        if (newBlock == nullptr) {
          rewind_block_index_tail();
          idxEntry->value.store(nullptr, std::memory_order_relaxed);
          return false;
        }
#ifdef MCDBGQ_TRACKMEM
        newBlock->owner = this;
#endif
        newBlock
            ->ConcurrentQueue::Block::template reset_empty<implicit_context>();

        MOODYCAMEL_CONSTEXPR_IF(!MOODYCAMEL_NOEXCEPT_CTOR(
            T, U, new (static_cast<T*>(nullptr)) T(std::forward<U>(element)))) {
          // May throw, try to insert now before we publish the fact that we
          // have this new block
          MOODYCAMEL_TRY {
            new ((*newBlock)[currentTailIndex]) T(std::forward<U>(element));
          }
          MOODYCAMEL_CATCH(...) {
            rewind_block_index_tail();
            idxEntry->value.store(nullptr, std::memory_order_relaxed);
            this->parent->add_block_to_free_list(newBlock);
            MOODYCAMEL_RETHROW;
          }
        }

        // Insert the new block into the index
        idxEntry->value.store(newBlock, std::memory_order_relaxed);

        this->tailBlock = newBlock;

        MOODYCAMEL_CONSTEXPR_IF(!MOODYCAMEL_NOEXCEPT_CTOR(
            T, U, new (static_cast<T*>(nullptr)) T(std::forward<U>(element)))) {
          this->tailIndex.store(newTailIndex, std::memory_order_release);
          return true;
        }
      }